

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::PrintfArgFormatter<char>::visit_custom(PrintfArgFormatter<char> *this,CustomValue c)

{
  code *in_RDX;
  UI_STRING *uis;
  UI *in_RSI;
  ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *in_RDI;
  char *format;
  char format_str [2];
  BasicFormatter<char,_fmt::ArgFormatter<char>_> formatter;
  BasicWriter<char> *w;
  ArgList *args;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *in_stack_ffffffffffffff80;
  undefined2 *local_70;
  undefined2 local_62;
  BasicWriter<char> local_60;
  ArgList local_50 [4];
  UI *local_10;
  code *local_8;
  
  w = &local_60;
  local_10 = in_RSI;
  local_8 = in_RDX;
  ArgList::ArgList((ArgList *)w);
  ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::writer(in_RDI,in_RSI,uis);
  args = local_50;
  BasicFormatter<char,_fmt::ArgFormatter<char>_>::BasicFormatter(in_stack_ffffffffffffff80,args,w);
  local_62 = 0x7d;
  local_70 = &local_62;
  (*local_8)(args,local_10,&local_70);
  BasicFormatter<char,_fmt::ArgFormatter<char>_>::~BasicFormatter
            ((BasicFormatter<char,_fmt::ArgFormatter<char>_> *)0x1700f3);
  return;
}

Assistant:

void visit_custom(Arg::CustomValue c) {
    BasicFormatter<Char> formatter(ArgList(), this->writer());
    const Char format_str[] = {'}', 0};
    const Char *format = format_str;
    c.format(&formatter, c.value, &format);
  }